

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O2

result * __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_baryonyx::file_observer>
::operator()(result *__return_storage_ptr__,
            solver_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_baryonyx::file_observer>
            *this,vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *constraints,int variables,default_cost_type<long_double> *original_costs,
            double cost_constant)

{
  double dVar1;
  double dVar2;
  double dVar3;
  init_policy_type iVar4;
  context *ctx;
  bool bVar5;
  int iVar6;
  int iVar7;
  rep rVar8;
  default_cost_type<long_double> *c;
  random_engine *rng;
  int iVar9;
  file_observer *x_optimistic;
  file_observer *x_pessimistic;
  long i;
  longdouble in_ST0;
  longdouble lVar10;
  longdouble lVar11;
  longdouble theta;
  longdouble lVar12;
  longdouble lVar13;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar14;
  longdouble in_ST5;
  longdouble lVar15;
  longdouble lVar16;
  double dVar17;
  double dVar18;
  string_view filename;
  int local_4fc;
  bit_array x;
  longdouble local_4cc;
  default_cost_type<long_double> norm_costs;
  compute_order compute;
  solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
  slv;
  file_observer obs;
  
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->duration = 0.0;
  __return_storage_ptr__->loop = 0;
  __return_storage_ptr__->variables = 0;
  __return_storage_ptr__->constraints = 0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->method)._M_len = 0;
  (__return_storage_ptr__->method)._M_str = (char *)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  bit_array_impl::bit_array_impl(&x.super_bit_array_impl,variables);
  ctx = this->m_ctx;
  c = (default_cost_type<long_double> *)this->m_rng;
  iVar9 = variables;
  normalize_costs<long_double,baryonyx::itm::default_cost_type<long_double>>
            ((itm *)&norm_costs,ctx,original_costs,(random_engine *)c,variables);
  lVar10 = (longdouble)(ctx->parameters).kappa_step;
  lVar11 = (longdouble)(ctx->parameters).kappa_max;
  theta = (longdouble)(ctx->parameters).theta;
  dVar18 = (ctx->parameters).delta;
  if (0.0 <= dVar18) {
    local_4cc = (longdouble)dVar18;
    lVar12 = in_ST0;
  }
  else {
    lVar13 = in_ST5;
    compute_delta<long_double,baryonyx::itm::default_cost_type<long_double>>
              ((longdouble *)this->m_ctx,(itm *)&norm_costs,(context *)(ulong)(uint)variables,c,
               theta,iVar9);
    lVar12 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = lVar13;
    local_4cc = in_ST0;
  }
  dVar2 = (ctx->parameters).pushing_k_factor;
  dVar3 = (ctx->parameters).pushing_objective_amplifier;
  dVar18 = (ctx->parameters).w;
  solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
  ::solver_inequalities_Zcoeff
            (&slv,this->m_rng,
             (int)(((long)(constraints->
                          super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(constraints->
                         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x28),variables,&norm_costs,
             constraints);
  compute_order::compute_order(&compute,(ctx->parameters).order,variables);
  dVar1 = (this->m_ctx->parameters).init_policy_random;
  obs.m_pi_obs.constraints = 0;
  obs.m_pi_obs.m_len = 0;
  obs.m_pi_obs.m_ofs = (ofstream)0x0;
  obs.m_pi_obs._9_7_ = 0;
  iVar4 = (ctx->parameters).init_policy;
  if (iVar4 == bastert) {
    init_with_bastert<baryonyx::itm::default_cost_type<long_double>,baryonyx::itm::minimize_tag>
              (&x,original_costs,variables,0);
  }
  else {
    if (iVar4 == pessimistic_solve) {
      rng = this->m_rng;
      x_pessimistic = (file_observer *)&x;
      x_optimistic = &obs;
    }
    else {
      if (iVar4 != optimistic_solve) goto LAB_0052c7fe;
      rng = this->m_rng;
      x_pessimistic = &obs;
      x_optimistic = (file_observer *)&x;
    }
    init_with_pre_solve<baryonyx::itm::default_cost_type<long_double>,baryonyx::itm::minimize_tag>
              ((bit_array *)x_pessimistic,(bit_array *)x_optimistic,rng,original_costs,constraints,
               1.0);
  }
LAB_0052c7fe:
  for (iVar9 = 0; x.super_bit_array_impl.m_size != iVar9; iVar9 = iVar9 + 1) {
    dVar17 = std::
             generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                       (this->m_rng);
    if (dVar17 < dVar1) {
      bit_array_impl::invert(&x.super_bit_array_impl,iVar9);
    }
  }
  std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
            ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
             &obs.m_pi_obs.m_ofs);
  dVar1 = (ctx->parameters).kappa_min;
  filename._M_str = "img";
  filename._M_len = 3;
  file_observer::file_observer(&obs,filename,slv.m,slv.n,(ctx->parameters).limit);
  rVar8 = std::chrono::_V2::steady_clock::now();
  (this->m_begin).__d.__r = rVar8;
  rVar8 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = rVar8;
  compute_order::
  init<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>,baryonyx::bit_array>
            (&compute,&slv,&x);
  iVar9 = 0x7fffffff;
  lVar13 = (longdouble)dVar1;
  for (i = 0; i != (ctx->parameters).limit; i = i + 1) {
    iVar6 = compute_order::
            run<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>,baryonyx::bit_array,long_double>
                      (&compute,&slv,&x,this->m_rng,lVar13,local_4cc,theta);
    file_observer::make_observation<long_double>
              (&obs,&slv.ap,
               (longdouble *)
               slv.P._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>.
               _M_t.super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
               super__Head_base<0UL,_long_double_*,_false>._M_head_impl,
               (longdouble *)
               slv.pi._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>.
               _M_t.super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
               super__Head_base<0UL,_long_double_*,_false>._M_head_impl);
    if (iVar6 == 0) {
      dVar18 = default_cost_type<long_double>::results(original_costs,&x,cost_constant);
      store_if_better(this,&x,dVar18,i);
      local_4fc = 0;
      iVar9 = 0;
      goto LAB_0052cadf;
    }
    if (iVar6 < iVar9) {
      store_if_better(this,&x,iVar6,i);
      iVar9 = iVar6;
    }
    if ((long)dVar18 < i) {
      lVar14 = in_ST5;
      powl();
      lVar13 = lVar13 + lVar10 * lVar12;
      lVar12 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = lVar14;
    }
    if ((lVar11 < lVar13) || (bVar5 = is_timelimit_reached(this), bVar5)) break;
  }
  __return_storage_ptr__->status = limit_reached;
LAB_0052c9f7:
  if ((this->m_best).remaining_constraints == 0) {
    __return_storage_ptr__->status = success;
  }
  if ((this->m_best).x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    convert<baryonyx::itm::minimize_tag>
              (&this->m_best,
               (__return_storage_ptr__->solutions).
               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
               super__Vector_impl_data._M_start,variables);
  }
  file_observer::~file_observer(&obs);
  compute_order::~compute_order(&compute);
  solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
  ::~solver_inequalities_Zcoeff(&slv);
  std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::~unique_ptr
            (&norm_costs.linear_elements);
  std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
            (&x.super_bit_array_impl.m_data);
  return __return_storage_ptr__;
LAB_0052cadf:
  if ((ctx->parameters).pushes_limit <= iVar9) goto LAB_0052c9f7;
  lVar14 = in_ST3;
  lVar15 = in_ST3;
  iVar6 = compute_order::
          push_and_run<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>,baryonyx::bit_array,long_double>
                    (&compute,&slv,&x,this->m_rng,(longdouble)dVar2 * lVar13,local_4cc,theta,
                     (longdouble)dVar3);
  if (iVar6 == 0) {
    dVar18 = default_cost_type<long_double>::results(original_costs,&x,cost_constant);
    store_if_better(this,&x,dVar18,(long)~((ctx->parameters).pushing_iteration_limit * iVar9));
  }
  bVar5 = is_timelimit_reached(this);
  if (bVar5) goto LAB_0052c9f7;
  for (iVar6 = 1; iVar6 + -1 < (ctx->parameters).pushing_iteration_limit; iVar6 = iVar6 + 1) {
    iVar7 = compute_order::
            run<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>,baryonyx::bit_array,long_double>
                      (&compute,&slv,&x,this->m_rng,lVar13,local_4cc,theta);
    if (iVar7 == 0) {
      dVar18 = default_cost_type<long_double>::results(original_costs,&x,cost_constant);
      store_if_better(this,&x,dVar18,
                      (long)((ctx->parameters).pushing_iteration_limit * local_4fc - iVar6));
      break;
    }
    if ((ctx->parameters).w < (double)(iVar6 + -1)) {
      lVar16 = lVar15;
      powl();
      lVar13 = lVar13 + lVar10 * lVar12;
      lVar12 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = lVar14;
      lVar14 = lVar15;
      lVar15 = lVar16;
    }
    if ((lVar11 < lVar13) || (bVar5 = is_timelimit_reached(this), bVar5)) break;
  }
  local_4fc = local_4fc + -1;
  iVar9 = iVar9 + 1;
  goto LAB_0052cadf;
}

Assistant:

result operator()(const std::vector<merged_constraint>& constraints,
                      int variables,
                      const Cost& original_costs,
                      double cost_constant)
    {
        result r;

        bit_array x(variables);

        int best_remaining = INT_MAX;

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const long int w_limit = static_cast<long int>(p.w);

        Solver slv(
          m_rng, length(constraints), variables, norm_costs, constraints);

        compute_order compute(p.order, variables);

        {
            std::bernoulli_distribution choose_mutation(
              m_ctx.parameters.init_policy_random);
            bit_array empty_x;

            switch (p.init_policy) {
            case solver_parameters::init_policy_type::pessimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  x, empty_x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::optimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  empty_x, x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::bastert:
                init_with_bastert<Cost, Mode>(x, original_costs, variables, 0);
                break;
            }

            for (int i = 0, e = x.size(); i != e; ++i)
                if (choose_mutation(m_rng))
                    x.invert(i);
        }

        bool start_push = false;
        auto kappa = static_cast<Float>(p.kappa_min);

        Observer obs("img", slv.m, slv.n, p.limit);

        m_begin = std::chrono::steady_clock::now();
        m_end = std::chrono::steady_clock::now();

        compute.init(slv, x);

        for (long int i = 0; i != p.limit; ++i) {
            auto remaining = compute.run(slv, x, m_rng, kappa, delta, theta);
            obs.make_observation(slv.ap, slv.P.get(), slv.pi.get());

            if (remaining == 0) {
                store_if_better(
                  x, original_costs.results(x, cost_constant), i);
                best_remaining = remaining;
                start_push = true;
                break;
            }

            if (remaining < best_remaining) {
                store_if_better(x, remaining, i);
                best_remaining = remaining;
            }

            if (i > w_limit)
                kappa += kappa_step * std::pow(static_cast<Float>(remaining) /
                                                 static_cast<Float>(slv.m),
                                               alpha);

            if (kappa > kappa_max) {
                r.status = result_status::kappa_max_reached;
                break;
            }

            if (is_timelimit_reached()) {
                r.status = result_status::time_limit_reached;
                break;
            }
        }

        if (!start_push) {
            r.status = result_status::limit_reached;
        } else {
            for (int push = 0; push < p.pushes_limit; ++push) {
                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_rng,
                                       pushing_k_factor * kappa,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0)
                    store_if_better(x,
                                    original_costs.results(x, cost_constant),
                                    -push * p.pushing_iteration_limit - 1);

                if (is_timelimit_reached())
                    break;

                for (int iter = 0; iter < p.pushing_iteration_limit; ++iter) {
                    remaining =
                      compute.run(slv, x, m_rng, kappa, delta, theta);

                    if (remaining == 0) {
                        store_if_better(
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;

                    if (is_timelimit_reached())
                        break;
                }
            }
        }

        if (m_best.remaining_constraints == 0)
            r.status = result_status::success;

        if (!m_best.x.empty()) {
            r.solutions.resize(1);
            convert(m_best, r.solutions[0], variables);
        }

        return r;
    }